

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Abort_Interactor(Am_Object *inter,bool update_now)

{
  Am_Inter_State AVar1;
  Am_Value *pAVar2;
  undefined1 local_70 [8];
  Am_Inter_Internal_Method method;
  Am_Input_Event ev;
  Am_Object local_20;
  Am_Inter_State local_18;
  byte local_11;
  Am_Inter_State state;
  bool update_now_local;
  Am_Object *inter_local;
  
  local_11 = update_now;
  _state = inter;
  Am_Object::Am_Object(&local_20,inter);
  AVar1 = Am_Get_Inter_State(&local_20);
  Am_Object::~Am_Object(&local_20);
  local_18 = AVar1;
  if ((AVar1 == Am_INTER_WAITING) || (AVar1 == Am_INTER_ABORTING)) {
    Am_Object::Set(inter,0x123,3,1);
  }
  else {
    Am_Input_Event::Am_Input_Event((Am_Input_Event *)&method.Call);
    pAVar2 = Am_Object::Get(inter,0xbc,0);
    Am_Input_Char::operator=((Am_Input_Char *)&method.Call,pAVar2);
    Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)local_70);
    pAVar2 = Am_Object::Get(inter,0xc4,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)local_70,pAVar2);
    (*(code *)method.from_wrapper)(inter,&Am_No_Object,&Am_No_Object,&method.Call);
    if ((local_11 & 1) != 0) {
      do_update();
    }
    Am_Input_Event::~Am_Input_Event((Am_Input_Event *)&method.Call);
  }
  return;
}

Assistant:

void
Am_Abort_Interactor(Am_Object inter, bool update_now)
{
  Am_Inter_State state = Am_Get_Inter_State(inter);

  if (state == Am_INTER_WAITING || state == Am_INTER_ABORTING) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT,
                         "Explicitly Aborting " << inter << " but not running");
    inter.Set(Am_CURRENT_STATE, (int)Am_INTER_ABORTING, Am_OK_IF_NOT_THERE);
    return;
  }
  // else is running, abort the interactor

  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SHORT, "Explicitly Aborting " << inter);
  Am_Input_Event ev;
  ev.input_char = inter.Get(Am_ABORT_WHEN);
  ev.x = 0;
  ev.y = 0;
  ev.draw = nullptr;
  ev.time_stamp = 0;
  Am_Inter_Internal_Method method;
  method = inter.Get(Am_INTER_ABORT_METHOD);
  method.Call(inter, Am_No_Object, Am_No_Object, &ev);
  if (update_now)
    do_update();
}